

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

void Bmc_MnaCollect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes,uint *pState)

{
  uint Value1;
  int iVar1;
  int fCompl1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  uint local_4c;
  uint *pState_local;
  Vec_Int_t *vNodes_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (-1 < *(long *)pObj) {
    *(ulong *)pObj = *(ulong *)pObj & 0x7fffffffffffffff | 0x8000000000000000;
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsRo(p,pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsPi(p,pObj);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                        ,0x9d,
                        "void Bmc_MnaCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, unsigned int *)"
                       );
        }
        pObj->Value = 3;
      }
      else {
        if (pState == (uint *)0x0) {
          local_4c = 1;
        }
        else {
          pGVar3 = Gia_ObjRoToRi(p,pObj);
          iVar1 = Gia_ObjCioId(pGVar3);
          local_4c = Gia_ManTerSimInfoGet(pState,iVar1);
        }
        pObj->Value = local_4c;
      }
    }
    else {
      pGVar3 = Gia_ObjFanin0(pObj);
      Bmc_MnaCollect_rec(p,pGVar3,vNodes,pState);
      pGVar3 = Gia_ObjFanin1(pObj);
      Bmc_MnaCollect_rec(p,pGVar3,vNodes,pState);
      pGVar3 = Gia_ObjFanin0(pObj);
      uVar2 = pGVar3->Value;
      iVar1 = Gia_ObjFaninC0(pObj);
      pGVar3 = Gia_ObjFanin1(pObj);
      Value1 = pGVar3->Value;
      fCompl1 = Gia_ObjFaninC1(pObj);
      uVar2 = Gia_XsimAndCond(uVar2,iVar1,Value1,fCompl1);
      pObj->Value = uVar2;
    }
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(vNodes,iVar1);
  }
  return;
}

Assistant:

void Bmc_MnaCollect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes, unsigned * pState )
{
    if ( pObj->fPhase )
        return;
    pObj->fPhase = 1;
    if ( Gia_ObjIsAnd(pObj) )
    {
        Bmc_MnaCollect_rec( p, Gia_ObjFanin0(pObj), vNodes, pState );
        Bmc_MnaCollect_rec( p, Gia_ObjFanin1(pObj), vNodes, pState );
        pObj->Value = Gia_XsimAndCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj), Gia_ObjFanin1(pObj)->Value, Gia_ObjFaninC1(pObj) );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        pObj->Value = pState ? Gia_ManTerSimInfoGet( pState, Gia_ObjCioId(Gia_ObjRoToRi(p, pObj)) ) : GIA_ZER;
    else if ( Gia_ObjIsPi(p, pObj) )
        pObj->Value = GIA_UND;
    else assert( 0 );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}